

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O3

void __thiscall TasGrid::CustomTabulated::read<false>(CustomTabulated *this,istream *is)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pvVar2;
  pointer pdVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar4;
  char cVar5;
  int iVar6;
  istream *this_00;
  istream *piVar7;
  invalid_argument *this_01;
  double *w;
  pointer pdVar8;
  size_type __new_size;
  long lVar9;
  long lVar10;
  char dummy;
  string T;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  CustomTabulated *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_88 = &local_78;
  local_80 = 0;
  local_78 = 0;
  ::std::operator>>(is,(string *)&local_88);
  iVar6 = ::std::__cxx11::string::compare((char *)&local_88);
  if (iVar6 == 0) {
    ::std::istream::get((char *)is);
    local_48 = 0;
    local_40 = 0;
    local_50 = &local_40;
    ::std::__cxx11::string::operator=((string *)&this->description,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    cVar5 = ::std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
    ::std::getline<char,std::char_traits<char>,std::allocator<char>>
              (is,(string *)&this->description,cVar5);
    ::std::operator>>(is,(string *)&local_88);
    iVar6 = ::std::__cxx11::string::compare((char *)&local_88);
    if (iVar6 == 0) {
      ::std::istream::operator>>((istream *)is,&this->num_levels);
      pvVar1 = &this->num_nodes;
      ::std::vector<int,_std::allocator<int>_>::resize(pvVar1,(long)this->num_levels);
      ::std::vector<int,_std::allocator<int>_>::resize(&this->precision,(long)this->num_levels);
      __new_size = (size_type)this->num_levels;
      if (0 < (long)__new_size) {
        lVar9 = 0;
        lVar10 = 0;
        do {
          this_00 = (istream *)
                    ::std::istream::operator>>
                              ((istream *)is,
                               (int *)((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data._M_start + lVar9));
          ::std::istream::operator>>
                    (this_00,(int *)((long)(this->precision).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + lVar9));
          lVar10 = lVar10 + 1;
          __new_size = (size_type)this->num_levels;
          lVar9 = lVar9 + 4;
        } while (lVar10 < (long)__new_size);
      }
      ::std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&this->nodes,__new_size);
      ::std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&this->weights,(long)this->num_levels);
      if (0 < this->num_levels) {
        lVar9 = 0;
        local_68 = &this->weights;
        local_60 = pvVar1;
        local_58 = this;
        do {
          pvVar1 = local_60;
          pvVar4 = local_68;
          ::std::vector<double,_std::allocator<double>_>::resize
                    ((this->nodes).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9,
                     (long)(local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar9]);
          ::std::vector<double,_std::allocator<double>_>::resize
                    ((pvVar4->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar9,
                     (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar9]);
          pvVar2 = (pvVar4->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = *(pointer *)
                    ((long)&pvVar2[lVar9].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
          for (pdVar8 = pvVar2[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start; pdVar8 != pdVar3; pdVar8 = pdVar8 + 1) {
            piVar7 = ::std::istream::_M_extract<double>((double *)is);
            ::std::istream::_M_extract<double>((double *)piVar7);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_58->num_levels);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      return;
    }
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_01,"ERROR: wrong file format of custom tables on line 2");
  }
  else {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_01,"ERROR: wrong file format of custom tables on line 1");
  }
  __cxa_throw(this_01,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void CustomTabulated::read(std::istream &is){
    if (iomode == mode_ascii){ // messy format chosen for better human readability, hard to template and generalize
        std::string T;
        char dummy;
        is >> T;
        if (!(T.compare("description:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 1"); }
        is.get(dummy);
        description = std::string();
        getline(is, description);

        is >> T;
        if (!(T.compare("levels:") == 0)){ throw std::invalid_argument("ERROR: wrong file format of custom tables on line 2"); }
        is >> num_levels;

        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        for(int i=0; i<num_levels; i++)
            is >> num_nodes[i] >> precision[i];

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            auto x = nodes[l].begin();
            for(auto &w : weights[l]) is >> w >> *x++;
        }
    }else{
        int num_description = 0;
        is.read((char*) &num_description, sizeof(int));
        std::vector<char> desc((size_t) num_description+1);
        is.read(desc.data(), num_description);
        desc[num_description] = '\0';
        description = desc.data();

        is.read((char*) &num_levels, sizeof(int));
        num_nodes.resize(num_levels);
        precision.resize(num_levels);
        is.read((char*) num_nodes.data(), num_levels * sizeof(int));
        is.read((char*) precision.data(), num_levels * sizeof(int));

        nodes.resize(num_levels);
        weights.resize(num_levels);
        for(int l=0; l<num_levels; l++){
            nodes[l].resize(num_nodes[l]);
            weights[l].resize(num_nodes[l]);
            is.read((char*) weights[l].data(), num_nodes[l] * sizeof(double));
            is.read((char*) nodes[l].data(), num_nodes[l] * sizeof(double));
        }
    }
}